

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::PrimitiveBoundingBoxTests::init
          (PrimitiveBoundingBoxTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  DepthType DVar7;
  TestContext *pTVar8;
  int extraout_EAX;
  TestNode *pTVar9;
  TestCase *pTVar10;
  QueryCase *pQVar11;
  TestNode *pTVar12;
  ulong uVar13;
  TestNode *node;
  BBoxRenderCase *this_00;
  long lVar14;
  BlitFboCase *pBVar15;
  ClearCase *pCVar16;
  ViewportCallOrderCase *pVVar17;
  long lVar18;
  uint numIterations;
  undefined8 in_R9;
  long lVar19;
  
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State queries");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  pTVar10 = (TestCase *)operator_new(0x78);
  gles31::TestCase::TestCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"initial_value","Initial value case");
  (pTVar10->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e614a8;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pTVar10);
  pQVar11 = (QueryCase *)operator_new(0x80);
  anon_unknown_1::QueryCase::QueryCase
            (pQVar11,(this->super_TestCaseGroup).m_context,"getfloat","getFloatv",QUERY_FLOAT);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pQVar11);
  pQVar11 = (QueryCase *)operator_new(0x80);
  anon_unknown_1::QueryCase::QueryCase
            (pQVar11,(this->super_TestCaseGroup).m_context,"getboolean","getBooleanv",QUERY_BOOLEAN)
  ;
  tcu::TestNode::addChild(pTVar9,(TestNode *)pQVar11);
  pQVar11 = (QueryCase *)operator_new(0x80);
  anon_unknown_1::QueryCase::QueryCase
            (pQVar11,(this->super_TestCaseGroup).m_context,"getinteger","getIntegerv",QUERY_INT);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pQVar11);
  pQVar11 = (QueryCase *)operator_new(0x80);
  anon_unknown_1::QueryCase::QueryCase
            (pQVar11,(this->super_TestCaseGroup).m_context,"getinteger64","getInteger64v",
             QUERY_INT64);
  tcu::TestNode::addChild(pTVar9,(TestNode *)pQVar11);
  lVar18 = 0;
  do {
    pTVar9 = (TestNode *)operator_new(0x70);
    pTVar8 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar18 == 5) {
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pTVar8,"depth","Test bounding box depth component");
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      lVar18 = 0;
      while( true ) {
        pTVar12 = (TestNode *)operator_new(0x70);
        pTVar8 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        if (lVar18 == 2) break;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar12,pTVar8,init::depthMethods[lVar18].name,
                   init::depthMethods[lVar18].description);
        tcu::TestNode::addChild(pTVar9,pTVar12);
        for (lVar14 = 0x10; lVar14 != 0x70; lVar14 = lVar14 + 0x18) {
          pTVar10 = (TestCase *)operator_new(200);
          DVar7 = init::depthMethods[lVar18].depthMethod;
          uVar1 = *(undefined8 *)((long)&init::depthCases[0].name + lVar14);
          gles31::TestCase::TestCase
                    (pTVar10,(this->super_TestCaseGroup).m_context,
                     *(char **)((long)&init::depthMethods[1].description + lVar14),
                     *(char **)((long)&init::depthMethods[1].depthMethod + lVar14));
          (pTVar10->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__DepthDrawCase_01e617a8;
          pTVar10[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x180000000e;
          *(DepthType *)&pTVar10[1].super_TestCase.super_TestNode.m_testCtx = DVar7;
          *(undefined8 *)((long)&pTVar10[1].super_TestCase.super_TestNode.m_testCtx + 4) = uVar1;
          pTVar10[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
          *(undefined8 *)((long)&pTVar10[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
          pTVar10[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
          pTVar10[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&pTVar10[1].super_TestCase.super_TestNode.m_description.field_2 + 8)
               = 0;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pTVar10);
        }
        lVar18 = lVar18 + 1;
      }
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,pTVar8,"blit_fbo",
                 "Test bounding box does not affect blitting");
      tcu::TestNode::addChild((TestNode *)this,pTVar12);
      pBVar15 = (BlitFboCase *)operator_new(0x100);
      anon_unknown_1::BlitFboCase::BlitFboCase
                (pBVar15,(this->super_TestCaseGroup).m_context,"blit_default_to_fbo",
                 "Blit from default fb to fbo",TARGET_DEFAULT,TARGET_FBO);
      tcu::TestNode::addChild(pTVar12,(TestNode *)pBVar15);
      pBVar15 = (BlitFboCase *)operator_new(0x100);
      anon_unknown_1::BlitFboCase::BlitFboCase
                (pBVar15,(this->super_TestCaseGroup).m_context,"blit_fbo_to_default",
                 "Blit from fbo to default fb",TARGET_FBO,TARGET_DEFAULT);
      tcu::TestNode::addChild(pTVar12,(TestNode *)pBVar15);
      pBVar15 = (BlitFboCase *)operator_new(0x100);
      anon_unknown_1::BlitFboCase::BlitFboCase
                (pBVar15,(this->super_TestCaseGroup).m_context,"blit_fbo_to_fbo",
                 "Blit from fbo to fbo",TARGET_FBO,TARGET_FBO);
      tcu::TestNode::addChild(pTVar12,(TestNode *)pBVar15);
      pTVar9 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"clear",
                 "Test bounding box does not clears");
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      pCVar16 = (ClearCase *)operator_new(0xe0);
      anon_unknown_1::ClearCase::ClearCase
                (pCVar16,(this->super_TestCaseGroup).m_context,"full_clear","Do full clears",0);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pCVar16);
      pCVar16 = (ClearCase *)operator_new(0xe0);
      anon_unknown_1::ClearCase::ClearCase
                (pCVar16,(this->super_TestCaseGroup).m_context,"full_clear_with_triangles",
                 "Do full clears and render some geometry",2);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pCVar16);
      pCVar16 = (ClearCase *)operator_new(0xe0);
      anon_unknown_1::ClearCase::ClearCase
                (pCVar16,(this->super_TestCaseGroup).m_context,
                 "full_clear_with_triangles_per_primitive_bbox",
                 "Do full clears and render some geometry",6);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pCVar16);
      pCVar16 = (ClearCase *)operator_new(0xe0);
      anon_unknown_1::ClearCase::ClearCase
                (pCVar16,(this->super_TestCaseGroup).m_context,"scissored_clear",
                 "Do scissored clears",1);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pCVar16);
      pCVar16 = (ClearCase *)operator_new(0xe0);
      anon_unknown_1::ClearCase::ClearCase
                (pCVar16,(this->super_TestCaseGroup).m_context,"scissored_clear_with_triangles",
                 "Do scissored clears and render some geometry",3);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pCVar16);
      pCVar16 = (ClearCase *)operator_new(0xe0);
      anon_unknown_1::ClearCase::ClearCase
                (pCVar16,(this->super_TestCaseGroup).m_context,
                 "scissored_clear_with_triangles_per_primitive_bbox",
                 "Do scissored clears and render some geometry",7);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pCVar16);
      pCVar16 = (ClearCase *)operator_new(0xe0);
      anon_unknown_1::ClearCase::ClearCase
                (pCVar16,(this->super_TestCaseGroup).m_context,"scissored_full_clear",
                 "Do full clears with enabled scissor",9);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pCVar16);
      pCVar16 = (ClearCase *)operator_new(0xe0);
      anon_unknown_1::ClearCase::ClearCase
                (pCVar16,(this->super_TestCaseGroup).m_context,"scissored_full_clear_with_triangles"
                 ,"Do full clears with enabled scissor and render some geometry",0xb);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pCVar16);
      pCVar16 = (ClearCase *)operator_new(0xe0);
      anon_unknown_1::ClearCase::ClearCase
                (pCVar16,(this->super_TestCaseGroup).m_context,
                 "scissored_full_clear_with_triangles_per_primitive_bbox",
                 "Do full clears with enabled scissor and render some geometry",0xf);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pCVar16);
      pTVar9 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "call_order","Test viewport and bounding box calls have no effect");
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      pVVar17 = (ViewportCallOrderCase *)operator_new(0xa8);
      anon_unknown_1::ViewportCallOrderCase::ViewportCallOrderCase
                (pVVar17,(this->super_TestCaseGroup).m_context,"viewport_first_bbox_second",
                 "Set up viewport first and bbox after",VIEWPORT_FIRST);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pVVar17);
      pVVar17 = (ViewportCallOrderCase *)operator_new(0xa8);
      anon_unknown_1::ViewportCallOrderCase::ViewportCallOrderCase
                (pVVar17,(this->super_TestCaseGroup).m_context,"bbox_first_viewport_second",
                 "Set up bbox first and viewport after",BBOX_FIRST);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pVVar17);
      return extraout_EAX;
    }
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,pTVar8,(char *)(&DAT_01e61370)[lVar18 * 3],
               (&PTR_anon_var_dwarf_2681e22_01e61378)[lVar18 * 3]);
    tcu::TestNode::addChild((TestNode *)this,pTVar9);
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      pTVar12 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::stateSetMethods[lVar14].name,init::stateSetMethods[lVar14].description);
      tcu::TestNode::addChild(pTVar9,pTVar12);
      uVar2 = init::stateSetMethods[lVar14].methodFlags;
      for (uVar13 = 0; uVar13 != 4; uVar13 = uVar13 + 1) {
        if (((uVar13 & 1) != 0) || ((uVar2 & 0x100) == 0)) {
          node = (TestNode *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)node,
                     (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                     init::pipelineConfigs[uVar13].name,init::pipelineConfigs[uVar13].description);
          tcu::TestNode::addChild(pTVar12,node);
          uVar3 = (&DAT_01e61384)[lVar18 * 6];
          uVar4 = init::pipelineConfigs[uVar13].stageFlags;
          for (lVar19 = 0; lVar19 != 0x100; lVar19 = lVar19 + 0x20) {
            numIterations =
                 *(uint *)((long)&init::usageConfigs[0].flags + lVar19) | uVar3 | uVar4 | uVar2;
            uVar5 = *(uint *)((long)&init::usageConfigs[0].invalidFlags + lVar19);
            if (((uVar5 == 0) || ((uVar5 & numIterations) == 0)) &&
               ((uVar5 = *(uint *)((long)&init::usageConfigs[0].requiredFlags + lVar19), uVar5 == 0
                || ((uVar5 & numIterations) != 0)))) {
              iVar6 = (&DAT_01e61380)[lVar18 * 6];
              if (iVar6 == 2) {
                this_00 = (BBoxRenderCase *)operator_new(0xf8);
                anon_unknown_1::BBoxRenderCase::BBoxRenderCase
                          (this_00,(this->super_TestCaseGroup).m_context,
                           *(char **)((long)&init::usageConfigs[0].name + lVar19),
                           *(char **)((long)&init::usageConfigs[0].description + lVar19),
                           numIterations,(deUint32)in_R9);
                (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                     (_func_int **)&PTR__PointRenderCase_01e61710;
                *(undefined4 *)&this_00->field_0xd4 = 4;
                *(byte *)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                     (byte)(numIterations >> 10) & 1;
                this_00[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
                     (TestContext *)0x0;
                this_00[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
                     (pointer)0x0;
                this_00[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
              }
              else if (iVar6 == 1) {
                this_00 = (BBoxRenderCase *)operator_new(0xe0);
                anon_unknown_1::BBoxRenderCase::BBoxRenderCase
                          (this_00,(this->super_TestCaseGroup).m_context,
                           *(char **)((long)&init::usageConfigs[0].name + lVar19),
                           *(char **)((long)&init::usageConfigs[0].description + lVar19),
                           numIterations,(deUint32)in_R9);
                (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                     (_func_int **)&PTR__BBoxRenderCase_01e61678;
                *(undefined4 *)&this_00->field_0xd4 = 0xc;
                *(byte *)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                     (byte)(numIterations >> 10) & 1;
                *(undefined4 *)
                 ((long)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
                     = 5;
              }
              else {
                if (iVar6 != 0) goto LAB_0138a190;
                this_00 = (BBoxRenderCase *)operator_new(0xd8);
                anon_unknown_1::BBoxRenderCase::BBoxRenderCase
                          (this_00,(this->super_TestCaseGroup).m_context,
                           *(char **)((long)&init::usageConfigs[0].name + lVar19),
                           *(char **)((long)&init::usageConfigs[0].description + lVar19),
                           numIterations,(deUint32)in_R9);
                (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                     (_func_int **)&PTR__BBoxRenderCase_01e61548;
                *(undefined4 *)&this_00->field_0xd4 = 0x18;
              }
              tcu::TestNode::addChild(node,(TestNode *)this_00);
            }
LAB_0138a190:
          }
        }
      }
    }
    lVar18 = lVar18 + 1;
  } while( true );
}

Assistant:

void PrimitiveBoundingBoxTests::init (void)
{
	static const struct
	{
		const char*	name;
		const char*	description;
		deUint32	methodFlags;
	} stateSetMethods[] =
	{
		{
			"global_state",
			"Set bounding box using PRIMITIVE_BOUNDING_BOX_EXT state",
			BBoxRenderCase::FLAG_SET_BBOX_STATE,
		},
		{
			"tessellation_set_per_draw",
			"Set bounding box using gl_BoundingBoxEXT, use same value for all primitives",
			BBoxRenderCase::FLAG_SET_BBOX_OUTPUT,
		},
		{
			"tessellation_set_per_primitive",
			"Set bounding box using gl_BoundingBoxEXT, use per-primitive bounding box",
			BBoxRenderCase::FLAG_SET_BBOX_OUTPUT | BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
		},
	};
	static const struct
	{
		const char*	name;
		const char*	description;
		deUint32	stageFlags;
	} pipelineConfigs[] =
	{
		{
			"vertex_fragment",
			"Render with vertex-fragment program",
			0u
		},
		{
			"vertex_tessellation_fragment",
			"Render with vertex-tessellation{ctrl,eval}-fragment program",
			BBoxRenderCase::FLAG_TESSELLATION
		},
		{
			"vertex_geometry_fragment",
			"Render with vertex-tessellation{ctrl,eval}-geometry-fragment program",
			BBoxRenderCase::FLAG_GEOMETRY
		},
		{
			"vertex_tessellation_geometry_fragment",
			"Render with vertex-geometry-fragment program",
			BBoxRenderCase::FLAG_TESSELLATION | BBoxRenderCase::FLAG_GEOMETRY
		},
	};
	static const struct
	{
		const char*	name;
		const char*	description;
		deUint32	flags;
		deUint32	invalidFlags;
		deUint32	requiredFlags;
	} usageConfigs[] =
	{
		{
			"default_framebuffer_bbox_equal",
			"Render to default framebuffer, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"default_framebuffer_bbox_larger",
			"Render to default framebuffer, set padded bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_LARGER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"default_framebuffer_bbox_smaller",
			"Render to default framebuffer, set too small bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_SMALLER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"fbo_bbox_equal",
			"Render to texture, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"fbo_bbox_larger",
			"Render to texture, set padded bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_LARGER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"fbo_bbox_smaller",
			"Render to texture, set too small bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_SMALLER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"default_framebuffer",
			"Render to default framebuffer, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			0,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX
		},
		{
			"fbo",
			"Render to texture, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			0,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX
		},
	};
	enum PrimitiveRenderType
	{
		TYPE_TRIANGLE,
		TYPE_LINE,
		TYPE_POINT,
	};
	const struct
	{
		const char*			name;
		const char*			description;
		PrimitiveRenderType	type;
		deUint32			flags;
	} primitiveTypes[] =
	{
		{
			"triangles",
			"Triangle render tests",
			TYPE_TRIANGLE,
			0
		},
		{
			"lines",
			"Line render tests",
			TYPE_LINE,
			0
		},
		{
			"points",
			"Point render tests",
			TYPE_POINT,
			0
		},
		{
			"wide_lines",
			"Wide line render tests",
			TYPE_LINE,
			LineRenderCase::LINEFLAG_WIDE
		},
		{
			"wide_points",
			"Wide point render tests",
			TYPE_POINT,
			PointRenderCase::POINTFLAG_WIDE
		},
	};

	// .state_query
	{
		tcu::TestCaseGroup* const stateQueryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "State queries");
		addChild(stateQueryGroup);

		stateQueryGroup->addChild(new InitialValueCase	(m_context,	"initial_value",	"Initial value case"));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getfloat",			"getFloatv",			QueryCase::QUERY_FLOAT));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getboolean",		"getBooleanv",			QueryCase::QUERY_BOOLEAN));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getinteger",		"getIntegerv",			QueryCase::QUERY_INT));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getinteger64",		"getInteger64v",		QueryCase::QUERY_INT64));
	}

	// .triangles
	// .(wide_)lines
	// .(wide_)points
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
	{
		tcu::TestCaseGroup* const primitiveGroup = new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, primitiveTypes[primitiveTypeNdx].description);
		addChild(primitiveGroup);

		for (int stateSetMethodNdx = 0; stateSetMethodNdx < DE_LENGTH_OF_ARRAY(stateSetMethods); ++stateSetMethodNdx)
		{
			tcu::TestCaseGroup* const methodGroup = new tcu::TestCaseGroup(m_testCtx, stateSetMethods[stateSetMethodNdx].name, stateSetMethods[stateSetMethodNdx].description);
			primitiveGroup->addChild(methodGroup);

			for (int pipelineConfigNdx = 0; pipelineConfigNdx < DE_LENGTH_OF_ARRAY(pipelineConfigs); ++pipelineConfigNdx)
			{
				if ((stateSetMethods[stateSetMethodNdx].methodFlags & BBoxRenderCase::FLAG_SET_BBOX_OUTPUT) != 0 &&
					(pipelineConfigs[pipelineConfigNdx].stageFlags  & BBoxRenderCase::FLAG_TESSELLATION)    == 0)
				{
					// invalid config combination
				}
				else
				{
					tcu::TestCaseGroup* const pipelineGroup = new tcu::TestCaseGroup(m_testCtx, pipelineConfigs[pipelineConfigNdx].name, pipelineConfigs[pipelineConfigNdx].description);
					methodGroup->addChild(pipelineGroup);

					for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageConfigs); ++usageNdx)
					{
						const deUint32 flags = primitiveTypes[primitiveTypeNdx].flags         |
											   stateSetMethods[stateSetMethodNdx].methodFlags |
											   pipelineConfigs[pipelineConfigNdx].stageFlags  |
											   usageConfigs[usageNdx].flags;

						if (usageConfigs[usageNdx].invalidFlags && (flags & usageConfigs[usageNdx].invalidFlags) != 0)
							continue;
						if (usageConfigs[usageNdx].requiredFlags && (flags & usageConfigs[usageNdx].requiredFlags) == 0)
							continue;

						switch (primitiveTypes[primitiveTypeNdx].type)
						{
							case TYPE_TRIANGLE:
								pipelineGroup->addChild(new GridRenderCase(m_context, usageConfigs[usageNdx].name, usageConfigs[usageNdx].description, flags));
								break;
							case TYPE_LINE:
								pipelineGroup->addChild(new LineRenderCase(m_context, usageConfigs[usageNdx].name, usageConfigs[usageNdx].description, flags));
								break;
							case TYPE_POINT:
								pipelineGroup->addChild(new PointRenderCase(m_context, usageConfigs[usageNdx].name, usageConfigs[usageNdx].description, flags));
								break;
							default:
								DE_ASSERT(false);
						}
					}
				}
			}
		}
	}

	// .depth
	{
		static const struct
		{
			const char*					name;
			const char*					description;
			DepthDrawCase::DepthType	depthMethod;
		} depthMethods[] =
		{
			{
				"builtin_depth",
				"Fragment depth not modified in fragment shader",
				DepthDrawCase::DEPTH_BUILTIN
			},
			{
				"user_defined_depth",
				"Fragment depth is defined in the fragment shader",
				DepthDrawCase::DEPTH_USER_DEFINED
			},
		};
		static const struct
		{
			const char*					name;
			const char*					description;
			DepthDrawCase::BBoxState	bboxState;
			DepthDrawCase::BBoxSize		bboxSize;
		} depthCases[] =
		{
			{
				"global_state_bbox_equal",
				"Test tight bounding box with global bbox state",
				DepthDrawCase::STATE_GLOBAL,
				DepthDrawCase::BBOX_EQUAL,
			},
			{
				"global_state_bbox_larger",
				"Test padded bounding box with global bbox state",
				DepthDrawCase::STATE_GLOBAL,
				DepthDrawCase::BBOX_LARGER,
			},
			{
				"per_primitive_bbox_equal",
				"Test tight bounding box with tessellation output bbox",
				DepthDrawCase::STATE_PER_PRIMITIVE,
				DepthDrawCase::BBOX_EQUAL,
			},
			{
				"per_primitive_bbox_larger",
				"Test padded bounding box with tessellation output bbox",
				DepthDrawCase::STATE_PER_PRIMITIVE,
				DepthDrawCase::BBOX_LARGER,
			},
		};

		tcu::TestCaseGroup* const depthGroup = new tcu::TestCaseGroup(m_testCtx, "depth", "Test bounding box depth component");
		addChild(depthGroup);

		// .builtin_depth
		// .user_defined_depth
		for (int depthNdx = 0; depthNdx < DE_LENGTH_OF_ARRAY(depthMethods); ++depthNdx)
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, depthMethods[depthNdx].name, depthMethods[depthNdx].description);
			depthGroup->addChild(group);

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(depthCases); ++caseNdx)
				group->addChild(new DepthDrawCase(m_context, depthCases[caseNdx].name, depthCases[caseNdx].description, depthMethods[depthNdx].depthMethod, depthCases[caseNdx].bboxState, depthCases[caseNdx].bboxSize));
		}
	}

	// .blit_fbo
	{
		tcu::TestCaseGroup* const blitFboGroup = new tcu::TestCaseGroup(m_testCtx, "blit_fbo", "Test bounding box does not affect blitting");
		addChild(blitFboGroup);

		blitFboGroup->addChild(new BlitFboCase(m_context, "blit_default_to_fbo", "Blit from default fb to fbo", BlitFboCase::TARGET_DEFAULT, BlitFboCase::TARGET_FBO));
		blitFboGroup->addChild(new BlitFboCase(m_context, "blit_fbo_to_default", "Blit from fbo to default fb", BlitFboCase::TARGET_FBO,     BlitFboCase::TARGET_DEFAULT));
		blitFboGroup->addChild(new BlitFboCase(m_context, "blit_fbo_to_fbo",     "Blit from fbo to fbo",        BlitFboCase::TARGET_FBO,     BlitFboCase::TARGET_FBO));
	}

	// .clear
	{
		tcu::TestCaseGroup* const clearGroup = new tcu::TestCaseGroup(m_testCtx, "clear", "Test bounding box does not clears");
		addChild(clearGroup);

		clearGroup->addChild(new ClearCase(m_context, "full_clear",                                             "Do full clears",                                               0));
		clearGroup->addChild(new ClearCase(m_context, "full_clear_with_triangles",                              "Do full clears and render some geometry",                      ClearCase::DRAW_TRIANGLE_BIT));
		clearGroup->addChild(new ClearCase(m_context, "full_clear_with_triangles_per_primitive_bbox",           "Do full clears and render some geometry",                      ClearCase::DRAW_TRIANGLE_BIT | ClearCase::PER_PRIMITIVE_BBOX_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_clear",                                        "Do scissored clears",                                          ClearCase::SCISSOR_CLEAR_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_clear_with_triangles",                         "Do scissored clears and render some geometry",                 ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_clear_with_triangles_per_primitive_bbox",      "Do scissored clears and render some geometry",                 ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT | ClearCase::PER_PRIMITIVE_BBOX_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_full_clear",                                   "Do full clears with enabled scissor",                          ClearCase::FULLSCREEN_SCISSOR_BIT | ClearCase::SCISSOR_CLEAR_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_full_clear_with_triangles",                    "Do full clears with enabled scissor and render some geometry", ClearCase::FULLSCREEN_SCISSOR_BIT | ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_full_clear_with_triangles_per_primitive_bbox", "Do full clears with enabled scissor and render some geometry", ClearCase::FULLSCREEN_SCISSOR_BIT | ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT | ClearCase::PER_PRIMITIVE_BBOX_BIT));
	}

	// .call_order (Khronos bug #13262)
	{
		tcu::TestCaseGroup* const callOrderGroup = new tcu::TestCaseGroup(m_testCtx, "call_order", "Test viewport and bounding box calls have no effect");
		addChild(callOrderGroup);

		callOrderGroup->addChild(new ViewportCallOrderCase(m_context, "viewport_first_bbox_second", "Set up viewport first and bbox after", ViewportCallOrderCase::VIEWPORT_FIRST));
		callOrderGroup->addChild(new ViewportCallOrderCase(m_context, "bbox_first_viewport_second", "Set up bbox first and viewport after", ViewportCallOrderCase::BBOX_FIRST));
	}
}